

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O3

LOs __thiscall
Omega_h::get_verts_onto(Omega_h *this,Mesh *mesh,LOs *rails2edges,Read<signed_char> *rail_col_dirs)

{
  int *piVar1;
  Alloc *pAVar2;
  long lVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar4;
  IntIterator last;
  int size_in;
  size_t sVar5;
  LOs LVar6;
  Write<int> keys2verts_onto_w;
  LOs ev2v;
  type set_key_onto;
  Write<int> local_128;
  Write<int> local_118;
  Alloc *local_108;
  element_type *local_100;
  string local_f8;
  Alloc *local_d8;
  element_type *local_d0;
  Alloc *local_c8;
  element_type *local_c0;
  Alloc *local_b8;
  element_type *peStack_b0;
  Alloc *local_a8;
  element_type *peStack_a0;
  Alloc *local_98;
  element_type *peStack_90;
  Alloc *local_88;
  element_type *peStack_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  
  pAVar2 = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar5 = pAVar2->size;
  }
  else {
    sVar5 = (ulong)pAVar2 >> 3;
  }
  Mesh::ask_verts_of((Mesh *)&local_108,(Int)mesh);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  size_in = (int)(sVar5 >> 2);
  Write<int>::Write(&local_128,size_in,-1,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_70._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_70._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_70._M_pi)->use_count = ((Alloc *)local_70._M_pi)->use_count + 1;
    }
  }
  local_68 = (element_type *)(rails2edges->write_).shared_alloc_.direct_ptr;
  local_60._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(rail_col_dirs->write_).shared_alloc_.alloc;
  if (((ulong)local_60._M_pi & 7) == 0 && (Alloc *)local_60._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_60._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_60._M_pi)->use_count = ((Alloc *)local_60._M_pi)->use_count + 1;
    }
  }
  local_58 = (element_type *)(rail_col_dirs->write_).shared_alloc_.direct_ptr;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128.shared_alloc_.alloc;
  if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
      local_128.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_128.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_128.shared_alloc_.alloc)->use_count = (local_128.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48 = (element_type *)local_128.shared_alloc_.direct_ptr;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_108->size * 8 + 1);
    }
    else {
      local_108->use_count = local_108->use_count + 1;
    }
  }
  local_38 = local_100;
  local_b8 = (Alloc *)local_70._M_pi;
  if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)((long)(local_70._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_a8 = (Alloc *)local_60._M_pi;
  if (((ulong)local_60._M_pi & 7) == 0 && (Alloc *)local_60._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)((long)(local_60._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_60._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_60._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_98 = (Alloc *)local_50._M_pi;
  if (((ulong)local_50._M_pi & 7) == 0 && (Alloc *)local_50._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)((long)(local_50._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_50._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_50._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_90 = (element_type *)local_128.shared_alloc_.direct_ptr;
  local_88 = (Alloc *)local_40._M_pi;
  if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)((long)(local_40._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_80 = local_100;
  peStack_b0 = local_68;
  peStack_a0 = local_58;
  if (0 < size_in) {
    local_f8._M_dataplus._M_p = (pointer)local_b8;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      local_f8._M_dataplus._M_p = (pointer)(local_b8->size * 8 + 1);
    }
    local_b8 = (Alloc *)0x0;
    peStack_b0 = (element_type *)0x0;
    local_f8.field_2._M_allocated_capacity = (size_type)local_a8;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      local_a8->use_count = local_a8->use_count + -1;
      local_f8.field_2._M_allocated_capacity = local_a8->size * 8 + 1;
    }
    local_a8 = (Alloc *)0x0;
    peStack_a0 = (element_type *)0x0;
    local_d0 = (element_type *)local_128.shared_alloc_.direct_ptr;
    local_d8 = local_98;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      local_d8 = (Alloc *)(local_98->size * 8 + 1);
    }
    local_98 = (Alloc *)0x0;
    peStack_90 = (element_type *)0x0;
    local_c0 = local_100;
    local_c8 = local_88;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_c8 = (Alloc *)(local_88->size * 8 + 1);
    }
    local_88 = (Alloc *)0x0;
    peStack_80 = (element_type *)0x0;
    entering_parallel = '\0';
    lVar3 = 0;
    do {
      *(undefined4 *)
       ((long)&(((Graph *)local_128.shared_alloc_.direct_ptr)->a2ab).write_.shared_alloc_.alloc +
       lVar3 * 4) = *(undefined4 *)
                     ((long)&local_100->library_ +
                     (long)((*(int *)((long)&(local_68->super_Graph).a2ab.write_.shared_alloc_.alloc
                                     + lVar3 * 4) * 2 + 1) -
                           (int)*(char *)((long)&(local_58->super_Graph).a2ab.write_.shared_alloc_.
                                                 alloc + lVar3)) * 4);
      lVar3 = lVar3 + 1;
    } while (size_in != (int)lVar3);
    local_f8._M_string_length = (size_type)local_68;
    local_f8.field_2._8_8_ = local_58;
    get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)&local_f8);
  }
  get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_b8);
  local_118.shared_alloc_.alloc = local_128.shared_alloc_.alloc;
  local_118.shared_alloc_.direct_ptr = local_128.shared_alloc_.direct_ptr;
  if ((((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
       local_128.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_128.shared_alloc_.alloc)->use_count = (local_128.shared_alloc_.alloc)->use_count + -1;
    local_118.shared_alloc_.alloc = (Alloc *)((local_128.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_128.shared_alloc_.alloc = (Alloc *)0x0;
  local_128.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_118);
  pAVar2 = local_118.shared_alloc_.alloc;
  if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
      local_118.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_118.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_70);
  pAVar2 = local_128.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
      local_128.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_128.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_128.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    piVar1 = &local_108->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108);
      operator_delete(local_108,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  LVar6.write_.shared_alloc_.direct_ptr = pvVar4;
  LVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar6.write_.shared_alloc_;
}

Assistant:

LOs get_verts_onto(Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs) {
  auto nkeys = rails2edges.size();
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto keys2verts_onto_w = Write<LO>(nkeys, -1);
  auto set_key_onto = OMEGA_H_LAMBDA(LO key) {
    auto e = rails2edges[key];
    auto eev = rail_col_dirs[key];
    keys2verts_onto_w[key] = ev2v[e * 2 + (1 - eev)];
  };
  parallel_for(nkeys, set_key_onto, "get_verts_onto");
  return keys2verts_onto_w;
}